

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.cc
# Opt level: O1

process_id_t __thiscall
tchecker::variable_access_map_t::accessing_process
          (variable_access_map_t *this,variable_id_t vid,variable_type_t vtype,
          variable_access_t vaccess)

{
  invalid_argument *this_00;
  range_t<boost::container::vec_iterator<unsigned_int_*,_true>,_boost::container::vec_iterator<unsigned_int_*,_true>_>
  range;
  pointer local_20;
  pointer local_18;
  
  accessing_processes((variable_access_map_t *)&stack0xffffffffffffffe0,(variable_id_t)this,vid,
                      vtype);
  if (local_18 == local_20) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Unknown variable");
  }
  else {
    if ((long)local_18 - (long)local_20 < 5) {
      if (local_20 != (pointer)0x0) {
        return (local_20->first).
               super__Tuple_impl<0UL,_unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>
               .super__Tuple_impl<1UL,_tchecker::variable_type_t,_tchecker::variable_access_t>.
               super__Tuple_impl<2UL,_tchecker::variable_access_t>.
               super__Head_base<2UL,_tchecker::variable_access_t,_false>._M_head_impl;
      }
      __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                    "reference boost::container::vec_iterator<unsigned int *, true>::operator*() const [Pointer = unsigned int *, IsConst = true]"
                   );
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Shared variable");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

process_id_t variable_access_map_t::accessing_process(tchecker::variable_id_t vid, enum tchecker::variable_type_t vtype,
                                                      enum tchecker::variable_access_t vaccess) const
{
  auto range = accessing_processes(vid, vtype, vaccess);
  auto d = std::distance(range.begin(), range.end());
  if (d == 0)
    throw std::invalid_argument("Unknown variable");
  if (d > 1)
    throw std::invalid_argument("Shared variable");
  return *range.begin();
}